

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O3

void pnga_get(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld)

{
  long lVar1;
  size_t sVar2;
  short sVar3;
  long lVar4;
  cache_struct *pcVar5;
  Integer IVar6;
  Integer IVar7;
  global_array_t *pgVar8;
  int iVar9;
  ulong uVar10;
  cache_struct_t *pcVar11;
  void *pvVar12;
  cache_struct_t *pcVar13;
  long lVar14;
  cache_struct *pcVar15;
  uint ndim;
  ulong uVar16;
  cache_struct_t **ppcVar17;
  int temp_hi [7];
  int temp_lo [7];
  Integer bstart [7];
  Integer nld [7];
  Integer ncount [7];
  Integer nstart [7];
  
  pgVar8 = GA;
  lVar1 = g_a + 1000;
  if (GA[lVar1].property != 2) {
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    return;
  }
  sVar3 = GA[lVar1].ndim;
  ndim = (uint)sVar3;
  ppcVar17 = &GA[lVar1].cache_head;
  pcVar13 = *ppcVar17;
  if (pcVar13 == (cache_struct_t *)0x0) {
    pcVar13 = (cache_struct_t *)malloc(0x48);
    *ppcVar17 = pcVar13;
    pgVar8 = GA;
    pcVar13 = GA[lVar1].cache_head;
    if (sVar3 < 1) {
      iVar9 = 1;
    }
    else {
      iVar9 = 1;
      uVar16 = 0;
      do {
        IVar6 = lo[uVar16];
        pcVar13->lo[uVar16] = (int)IVar6;
        IVar7 = hi[uVar16];
        pcVar13->hi[uVar16] = (int)IVar7;
        iVar9 = iVar9 * (((int)IVar7 - (int)IVar6) + 1);
        uVar16 = uVar16 + 1;
      } while (ndim != uVar16);
    }
    pvVar12 = malloc((long)iVar9 * (long)pgVar8[lVar1].elemsize);
    pcVar13->cache_buf = pvVar12;
    pcVar13->next = (cache_struct *)0x0;
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    if (0 < sVar3) {
      sVar2 = (ulong)ndim * 8;
      uVar16 = 0;
      memset(nstart,0,sVar2);
      memset(bstart,0,sVar2);
      do {
        lVar14 = (hi[uVar16] - lo[uVar16]) + 1;
        nld[uVar16] = lVar14;
        ncount[uVar16] = lVar14;
        uVar16 = uVar16 + 1;
      } while (ndim != uVar16);
    }
    iVar9 = GA[lVar1].elemsize;
  }
  else {
    uVar16 = (ulong)ndim;
    sVar2 = uVar16 * 4;
    pcVar15 = pcVar13;
    do {
      pvVar12 = pcVar15->cache_buf;
      if (sVar3 < 1) goto LAB_00188337;
      memcpy(temp_lo,pcVar15,sVar2);
      memcpy(temp_hi,pcVar15->hi,sVar2);
      uVar10 = 0;
      while (((long)temp_lo[uVar10] <= lo[uVar10] && (hi[uVar10] <= (long)temp_hi[uVar10]))) {
        uVar10 = uVar10 + 1;
        if (uVar16 == uVar10) {
          if (0 < sVar3) {
            lVar14 = 0;
            memset(bstart,0,uVar16 * 8);
            do {
              lVar4 = *(long *)((long)lo + lVar14 * 2);
              iVar9 = *(int *)((long)temp_lo + lVar14);
              *(long *)((long)nstart + lVar14 * 2) = lVar4 - iVar9;
              *(long *)((long)nld + lVar14 * 2) =
                   (long)((*(int *)((long)temp_hi + lVar14) - iVar9) + 1);
              *(long *)((long)ncount + lVar14 * 2) = (*(long *)((long)hi + lVar14 * 2) - lVar4) + 1;
              lVar14 = lVar14 + 4;
            } while (sVar2 - lVar14 != 0);
          }
          goto LAB_00188337;
        }
      }
      pcVar15 = pcVar15->next;
    } while (pcVar15 != (cache_struct *)0x0);
    pcVar11 = (cache_struct_t *)malloc(0x48);
    iVar9 = 1;
    uVar10 = 0;
    do {
      IVar6 = lo[uVar10];
      pcVar11->lo[uVar10] = (int)IVar6;
      IVar7 = hi[uVar10];
      pcVar11->hi[uVar10] = (int)IVar7;
      iVar9 = iVar9 * (((int)IVar7 - (int)IVar6) + 1);
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
    pvVar12 = malloc((long)iVar9 * (long)pgVar8[lVar1].elemsize);
    pcVar11->cache_buf = pvVar12;
    pcVar11->next = pcVar13;
    *ppcVar17 = pcVar11;
    uVar10 = 0;
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)0x0);
    memset(nstart,0,uVar16 * 8);
    memset(bstart,0,uVar16 * 8);
    do {
      lVar14 = (hi[uVar10] - lo[uVar10]) + 1;
      nld[uVar10] = lVar14;
      ncount[uVar10] = lVar14;
      uVar10 = uVar10 + 1;
    } while (uVar16 != uVar10);
    iVar9 = GA[lVar1].elemsize;
  }
  gai_mem_copy(iVar9,ndim,buf,bstart,ncount,ld,pvVar12,nstart,nld);
LAB_001884d6:
  pcVar13 = GA[lVar1].cache_head;
  if (pcVar13 != (cache_struct_t *)0x0) {
    pcVar15 = pcVar13->next;
    pcVar13->next = (cache_struct *)0x0;
    pcVar5 = pcVar15;
    while (pcVar5 != (cache_struct *)0x0) {
      pcVar5 = pcVar15->next;
      free(pcVar15->cache_buf);
      free(pcVar15);
    }
  }
  return;
LAB_00188337:
  gai_mem_copy(pgVar8[lVar1].elemsize,ndim,pvVar12,nstart,ncount,nld,buf,bstart,ncount);
  goto LAB_001884d6;
}

Assistant:

void pnga_get(Integer g_a, Integer *lo, Integer *hi,
              void *buf, Integer *ld)
{
  Integer handle = GA_OFFSET + g_a;
  enum property_type ga_property = GA[handle].property;

  if (ga_property != READ_CACHE) /* if array is not read only */
  {
    GA_Internal_Threadsafe_Lock();
    ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);
    GA_Internal_Threadsafe_Unlock();
  } else {
    int i;
    int nelem;
    int ndim = GA[handle].ndim;
    Integer nstart[MAXDIM], ncount[MAXDIM], nld[MAXDIM];
    Integer bstart[MAXDIM];
    /* ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL); */

    /* cache is empty condition */
    if (GA[handle].cache_head == NULL) {
      GA[handle].cache_head = malloc(sizeof(cache_struct_t));
      nelem = 1;
      for (i=0; i<ndim; i++) {
        GA[handle].cache_head -> lo[i] = lo[i];
        GA[handle].cache_head -> hi[i] = hi[i];
        nelem *= (hi[i]-lo[i]+1);
      }
      GA[handle].cache_head -> cache_buf = malloc(GA[handle].elemsize*nelem);
      GA[handle].cache_head -> next = NULL;

        void *new_buf = GA[handle].cache_head->cache_buf;

      /* place data to receive buffer */
      ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer*)NULL);
   
      for (i=0; i<ndim; i++) {
        nstart[i] = 0;
        bstart[i] = 0;
        nld[i] = (hi[i]-lo[i]+1);
        ncount[i] = nld[i];
      }
      gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
          nstart, nld);
    } else {

      cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
      int match = 0;
      while (cache_temp_pointer != NULL) {
        int chk;
        int sub_chk;
        int temp_lo[MAXDIM];
        int temp_hi[MAXDIM];
        void *temp_buf = cache_temp_pointer->cache_buf;
        for (i=0; i<ndim; i++) {
          temp_lo[i] = cache_temp_pointer->lo[i];
          temp_hi[i] = cache_temp_pointer->hi[i];
        }

        //match
        chk = 1;
        for (i=0; i<ndim; i++) {
          if (!(temp_lo[i] <= lo[i] && temp_hi[i] >= hi[i])) {
            chk = 0;
            break;
          }
        }
        //match
        if (chk) {
          nelem = 1;
          for (i=0; i<ndim; i++) {
            nelem *= (hi[i]-lo[i]+1);
          }
          for (i=0; i<ndim; i++) {
            nstart[i] = (lo[i]-temp_lo[i]);
            bstart[i] = 0;
            nld[i] = (temp_hi[i]-temp_lo[i]+1);
            ncount[i] = (hi[i]-lo[i]+1);
          }
          /* copy data to recieve buffer */
          gai_mem_copy(GA[handle].elemsize,ndim,temp_buf,nstart,ncount,nld,buf,
              bstart, ncount /*ld*/);
          match = 1;
          break;
        }

        cache_temp_pointer = cache_temp_pointer->next;

      }

      //no match condition
      if (match == 0) {
        void *new_buf;
        /* create new node on cache list*/
        cache_struct_t *cache_new = malloc(sizeof(cache_struct_t));
        nelem = 1;
        for (i=0; i<ndim; i++) {
          cache_new -> lo[i] = lo[i];
          cache_new -> hi[i] = hi[i];
          nelem *= (hi[i]-lo[i]+1);
        }
        cache_new -> cache_buf = malloc(GA[handle].elemsize*nelem);
        new_buf = cache_new->cache_buf;
        cache_new -> next = GA[handle].cache_head;
        GA[handle].cache_head = cache_new;


        //place data to recieve buffer
        ngai_get_common(g_a,lo,hi,buf,ld,0,-1,(Integer *)NULL);

        for (i=0; i<ndim; i++) {
          nstart[i] = 0;
          bstart[i] = 0;
          nld[i] = (hi[i]-lo[i]+1);
          ncount[i] = nld[i];
        }
        gai_mem_copy(GA[handle].elemsize,ndim,buf,bstart,ncount,ld,new_buf,
            nstart, nld);
      }
    }

    /* check number of items cached */
    cache_struct_t * cache_temp_pointer = GA[handle].cache_head;
    int cache_size = 0;

    /* check number of items cached */
    while (cache_temp_pointer != NULL) {
      if (cache_size > MAXCACHE) {
        cache_struct_t *last = cache_temp_pointer;
        cache_struct_t *next = last->next;
        last->next = NULL;
        cache_temp_pointer = next;
        while (next) {
          next = cache_temp_pointer->next;
          free(cache_temp_pointer->cache_buf);
          free(cache_temp_pointer);
        }
        break;
      }
      cache_size++;
    }
    /* end */
  }
}